

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::GetMemberOfVectorOfNonStruct
          (PhpGenerator *this,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  size_t sVar2;
  Type *type;
  Type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Type local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  Type vectortype;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  PhpGenerator *this_local;
  
  vectortype._24_8_ = code_ptr;
  Type::VectorType((Type *)local_48,&(field->value).type);
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param int offset\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+(&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return ");
  GenTypeGet_abi_cxx11_(&local_118,(PhpGenerator *)&field->value,type);
  std::operator+(&local_d8,&local_f8,&local_118);
  std::operator+(&local_b8,&local_d8,"\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::operator+(&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public function get");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  ConvertCase(&local_178,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"($j)\n");
  std::operator+(&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::operator+(&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_1f8,&local_218,"$o = $this->__offset(");
  NumToString<unsigned_short>(&local_238,(field->value).offset);
  std::operator+(&local_1d8,&local_1f8,&local_238);
  std::operator+(&local_1b8,&local_1d8,");\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  Type::VectorType(&local_258,&(field->value).type);
  bVar1 = IsString(&local_258);
  if (bVar1) {
    std::operator+(&local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::operator+=
              ((string *)vectortype._24_8_,
               "return $o != 0 ? $this->__string($this->__vector($o) + $j * ");
    sVar2 = InlineSize((Type *)local_48);
    NumToString<unsigned_long>(&local_2b8,sVar2);
    std::operator+(&local_298,&local_2b8,") : ");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    GenDefaultValue_abi_cxx11_(&local_2f8,this,&field->value);
    std::operator+(&local_2d8,&local_2f8,";\n");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
  }
  else {
    std::operator+(&local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Indent_abi_cxx11_);
    std::operator+(&local_318,&local_338,"return $o != 0 ? $this->bb->get");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    GenTypeGet_abi_cxx11_(&local_378,(PhpGenerator *)&field->value,type_00);
    ConvertCase(&local_358,&local_378,kUpperCamel,kSnake);
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"($this->__vector($o) + $j * ");
    sVar2 = InlineSize((Type *)local_48);
    NumToString<unsigned_long>(&local_3b8,sVar2);
    std::operator+(&local_398,&local_3b8,") : ");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    GenDefaultValue_abi_cxx11_(&local_3f8,this,&field->value);
    std::operator+(&local_3d8,&local_3f8,";\n");
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  std::operator+(&local_418,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  return;
}

Assistant:

void GetMemberOfVectorOfNonStruct(const FieldDef &field,
                                    std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    code += Indent + "/**\n";
    code += Indent + " * @param int offset\n";
    code += Indent + " * @return " + GenTypeGet(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "($j)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$o = $this->__offset(" +
            NumToString(field.value.offset) + ");\n";

    if (IsString(field.value.type.VectorType())) {
      code += Indent + Indent;
      code += "return $o != 0 ? $this->__string($this->__vector($o) + $j * ";
      code += NumToString(InlineSize(vectortype)) + ") : ";
      code += GenDefaultValue(field.value) + ";\n";
    } else {
      code += Indent + Indent + "return $o != 0 ? $this->bb->get";
      code += ConvertCase(GenTypeGet(field.value.type), Case::kUpperCamel);
      code += "($this->__vector($o) + $j * ";
      code += NumToString(InlineSize(vectortype)) + ") : ";
      code += GenDefaultValue(field.value) + ";\n";
    }
    code += Indent + "}\n\n";
  }